

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_compressionParameters *
ZSTD_getCParamsFromCCtxParams
          (ZSTD_compressionParameters *__return_storage_ptr__,ZSTD_CCtx_params *CCtxParams,
          U64 srcSizeHint,size_t dictSize)

{
  ZSTD_compressionParameters cPar;
  undefined1 local_40 [8];
  ZSTD_compressionParameters cParams;
  size_t dictSize_local;
  U64 srcSizeHint_local;
  ZSTD_CCtx_params *CCtxParams_local;
  
  unique0x10000231 = dictSize;
  ZSTD_getCParams((ZSTD_compressionParameters *)local_40,CCtxParams->compressionLevel,srcSizeHint,
                  dictSize);
  if ((CCtxParams->ldmParams).enableLdm != 0) {
    local_40._0_4_ = 0x1b;
  }
  if ((CCtxParams->cParams).windowLog != 0) {
    local_40._0_4_ = (CCtxParams->cParams).windowLog;
  }
  if ((CCtxParams->cParams).hashLog != 0) {
    cParams.windowLog = (CCtxParams->cParams).hashLog;
  }
  if ((CCtxParams->cParams).chainLog != 0) {
    local_40._4_4_ = (CCtxParams->cParams).chainLog;
  }
  if ((CCtxParams->cParams).searchLog != 0) {
    cParams.chainLog = (CCtxParams->cParams).searchLog;
  }
  if ((CCtxParams->cParams).minMatch != 0) {
    cParams.hashLog = (CCtxParams->cParams).minMatch;
  }
  if ((CCtxParams->cParams).targetLength != 0) {
    cParams.searchLog = (CCtxParams->cParams).targetLength;
  }
  if ((CCtxParams->cParams).strategy != 0) {
    cParams.minMatch = (CCtxParams->cParams).strategy;
  }
  cPar.chainLog = local_40._4_4_;
  cPar.windowLog = local_40._0_4_;
  cPar.searchLog = cParams.chainLog;
  cPar.hashLog = cParams.windowLog;
  cPar.targetLength = cParams.searchLog;
  cPar.minMatch = cParams.hashLog;
  cPar.strategy = cParams.minMatch;
  ZSTD_adjustCParams_internal(__return_storage_ptr__,cPar,srcSizeHint,stack0xffffffffffffffe0);
  return __return_storage_ptr__;
}

Assistant:

ZSTD_compressionParameters ZSTD_getCParamsFromCCtxParams(
        const ZSTD_CCtx_params* CCtxParams, U64 srcSizeHint, size_t dictSize)
{
    ZSTD_compressionParameters cParams = ZSTD_getCParams(CCtxParams->compressionLevel, srcSizeHint, dictSize);
    if (CCtxParams->ldmParams.enableLdm) cParams.windowLog = ZSTD_LDM_DEFAULT_WINDOW_LOG;
    if (CCtxParams->cParams.windowLog) cParams.windowLog = CCtxParams->cParams.windowLog;
    if (CCtxParams->cParams.hashLog) cParams.hashLog = CCtxParams->cParams.hashLog;
    if (CCtxParams->cParams.chainLog) cParams.chainLog = CCtxParams->cParams.chainLog;
    if (CCtxParams->cParams.searchLog) cParams.searchLog = CCtxParams->cParams.searchLog;
    if (CCtxParams->cParams.minMatch) cParams.minMatch = CCtxParams->cParams.minMatch;
    if (CCtxParams->cParams.targetLength) cParams.targetLength = CCtxParams->cParams.targetLength;
    if (CCtxParams->cParams.strategy) cParams.strategy = CCtxParams->cParams.strategy;
    assert(!ZSTD_checkCParams(cParams));
    return ZSTD_adjustCParams_internal(cParams, srcSizeHint, dictSize);
}